

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line-parser.cpp
# Opt level: O0

void license::printBasicHelp(char *prog_name)

{
  string *psVar1;
  ostream *poVar2;
  void *this;
  path local_50;
  path local_30;
  value_type *local_10;
  char *prog_name_local;
  
  local_10 = prog_name;
  printHelpHeader(prog_name);
  boost::filesystem::path::path(&local_50,local_10);
  boost::filesystem::path::filename();
  psVar1 = boost::filesystem::path::string_abi_cxx11_(&local_30);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)psVar1);
  poVar2 = std::operator<<(poVar2," [command] [options]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  boost::filesystem::path::~path(&local_30);
  boost::filesystem::path::~path(&local_50);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           " available commands: \"project initialize\", \"project list\", \"license issue\", \"license list\""
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout," to see help on specific command options type: ");
  poVar2 = std::operator<<(poVar2,local_10);
  poVar2 = std::operator<<(poVar2," [command] --help");
  this = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void printBasicHelp(const char *prog_name) {
	printHelpHeader(prog_name);
	cout << fs::path(prog_name).filename().string() << " [command] [options]" << endl;
	cout << " available commands: \"project initialize\", \"project list\", \"license issue\", \"license list\""
		 << endl;
	cout << " to see help on specific command options type: " << prog_name << " [command] --help" << endl << endl;
}